

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-mongo.c
# Opt level: O3

int reply_length(lua_State *L)

{
  int *piVar1;
  
  piVar1 = (int *)luaL_checklstring(L,1,(size_t *)0x0);
  lua_pushinteger(L,(long)*piVar1 + -4);
  return 1;
}

Assistant:

static int
reply_length(lua_State *L) {
	const char * rawlen_str = luaL_checkstring(L, 1);
	int rawlen = 0;
	memcpy(&rawlen, rawlen_str, sizeof(int));
	int length = little_endian(rawlen);
	lua_pushinteger(L, length - 4);
	return 1;
}